

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaKf.c
# Opt level: O3

void Kf_SetSelectBest(Kf_Set_t *p,int fArea,int fSort)

{
  int *__s;
  Kf_Cut_t *pKVar1;
  Kf_Cut_t *pKVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  Kf_Cut_t *pKVar6;
  Kf_Cut_t **ppKVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar10 = (ulong)p->nLutSize;
  __s = p->pList;
  pKVar1 = p->pCutsR;
  uVar8 = 0;
  uVar5 = 0;
  do {
    uVar3 = __s[uVar5];
    if (-1 < (int)uVar3) {
      uVar4 = p->nCutNum - 1;
      do {
        pKVar6 = pKVar1 + uVar3;
        p->ppCuts[(int)uVar8] = pKVar6;
        if (uVar8 == 0) {
          uVar8 = 1;
        }
        else {
          if (0 < (int)uVar8) {
            uVar9 = (ulong)uVar8;
            do {
              pKVar2 = p->ppCuts[uVar9 - 1];
              if (fArea == 0) {
                if (pKVar2->Delay < pKVar6->Delay) break;
                if (pKVar2->Delay <= pKVar6->Delay) {
                  if ((pKVar2->nLeaves < pKVar6->nLeaves) ||
                     ((pKVar2->nLeaves <= pKVar6->nLeaves &&
                      (pKVar2->Area < pKVar6->Area || pKVar2->Area == pKVar6->Area)))) break;
                }
              }
              else {
                if (pKVar2->Area < pKVar6->Area) break;
                if (pKVar2->Area <= pKVar6->Area) {
                  if ((pKVar2->Delay < pKVar6->Delay) ||
                     ((pKVar2->Delay <= pKVar6->Delay && (pKVar2->nLeaves <= pKVar6->nLeaves))))
                  break;
                }
              }
              p->ppCuts[uVar9 - 1] = pKVar6;
              p->ppCuts[uVar9] = pKVar2;
              bVar11 = 1 < uVar9;
              uVar9 = uVar9 - 1;
            } while (bVar11);
          }
          uVar8 = uVar8 + 1;
          if ((int)uVar4 <= (int)uVar8) {
            uVar8 = uVar4;
          }
        }
        uVar3 = pKVar6->iNext;
      } while (-1 < (int)uVar3);
    }
    bVar11 = uVar5 == uVar10;
    uVar5 = uVar5 + 1;
    if (bVar11) {
      if (((int)uVar8 < 1) || (p->nCutNum <= uVar8)) {
        __assert_fail("nCuts > 0 && nCuts < p->nCutNum",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x124,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
      }
      p->nCuts = uVar8;
      p->pCutBest = p->ppCuts[0];
      memset(__s,0xff,uVar10 * 4 + 4);
      uVar5 = 0;
      do {
        pKVar6 = p->ppCuts[uVar5];
        pKVar6->iNext = p->pList[pKVar6->nLeaves];
        p->pList[pKVar6->nLeaves] = (int)((ulong)((long)pKVar6 - (long)pKVar1) >> 5) * -0x55555555;
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      p->nCuts = 0;
      uVar3 = 0;
      do {
        uVar4 = __s[uVar10];
        if (-1 < (int)uVar4) {
          ppKVar7 = p->ppCuts + (int)uVar3;
          do {
            *ppKVar7 = pKVar1 + uVar4;
            uVar4 = p->pCutsR[uVar4].iNext;
            ppKVar7 = ppKVar7 + 1;
            uVar3 = uVar3 + 1;
          } while (-1 < (int)uVar4);
          p->nCuts = uVar3;
        }
        bVar11 = 0 < (long)uVar10;
        uVar10 = uVar10 - 1;
      } while (bVar11);
      if (uVar3 != uVar8) {
        __assert_fail("p->nCuts == nCuts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaKf.c"
                      ,0x132,"void Kf_SetSelectBest(Kf_Set_t *, int, int)");
      }
      return;
    }
  } while( true );
}

Assistant:

static inline void Kf_SetSelectBest( Kf_Set_t * p, int fArea, int fSort )
{
//    int fArea = p->pMan->pPars->fArea;
    Kf_Cut_t * pCut;
    int i, nCuts = 0;
    for ( i = 0; i <= p->nLutSize; i++ )
        Kf_ListForEachCut( p, i, pCut )
            nCuts = Kf_SetStoreAddOne( p, nCuts, p->nCutNum-1, pCut, fArea );
    assert( nCuts > 0 && nCuts < p->nCutNum );
    p->nCuts = nCuts;
    p->pCutBest = p->ppCuts[0];
    if ( !fSort )
        return;
    // sort by size in the reverse order
    for ( i = 0; i <= p->nLutSize; i++ )
        p->pList[i] = -1;
    for ( i = 0; i < nCuts; i++ )
        Kf_SetAddToList( p, p->ppCuts[i], 0 );
    p->nCuts = 0;
    for ( i = p->nLutSize; i >= 0; i-- )
        Kf_ListForEachCut( p, i, pCut )
            p->ppCuts[p->nCuts++] = pCut;
    assert( p->nCuts == nCuts );
}